

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

bool TestEvaluation(ExpressionContext *ctx,ExprBase *expression,char *resultBuf,uint resultBufSize,
                   char *errorBuf,uint errorBufSize)

{
  bool bVar1;
  ExpressionEvalContext local_298;
  
  if (expression == (ExprBase *)0x0) {
    bVar1 = false;
  }
  else {
    local_298.stackFrames.allocator = ctx->allocator;
    local_298.stackFrames.data = local_298.stackFrames.little;
    local_298.stackFrames.count = 0;
    local_298.stackFrames.max = 0x20;
    local_298.abandonedMemory.data = local_298.abandonedMemory.little;
    local_298.abandonedMemory.count = 0;
    local_298.abandonedMemory.max = 0x20;
    local_298.errorCritical = false;
    local_298.globalFrame = (StackFrame *)0x0;
    local_298.stackDepthLimit = 0x40;
    local_298.variableMemoryLimit = 0x2000;
    local_298.totalMemory = 0;
    local_298.totalMemoryLimit = 0x10000;
    local_298.instruction = 0;
    local_298.instructionsLimit = 0x10000;
    local_298.expressionDepth = 0;
    local_298.expressionDepthLimit = 0x800;
    local_298.emulateKnownExternals = true;
    local_298.ctx = ctx;
    local_298.errorBuf = errorBuf;
    local_298.errorBufSize = errorBufSize;
    local_298.abandonedMemory.allocator = local_298.stackFrames.allocator;
    bVar1 = EvaluateToBuffer(&local_298,expression,resultBuf,resultBufSize);
    SmallArray<ExprPointerLiteral_*,_32U>::~SmallArray(&local_298.abandonedMemory);
    SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::~SmallArray(&local_298.stackFrames);
  }
  return bVar1;
}

Assistant:

bool TestEvaluation(ExpressionContext &ctx, ExprBase *expression, char *resultBuf, unsigned resultBufSize, char *errorBuf, unsigned errorBufSize)
{
	if(!expression)
		return false;

	ExpressionEvalContext evalCtx(ctx, ctx.allocator);

	evalCtx.errorBuf = errorBuf;
	evalCtx.errorBufSize = errorBufSize;

	evalCtx.emulateKnownExternals = true;

	return EvaluateToBuffer(evalCtx, expression, resultBuf, resultBufSize);
}